

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

void template_conformarray(t_template *tfrom,t_template *tto,int *conformaction,_array *a)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  t_dataslot *ds;
  t_word *wp_1;
  t_word *wp;
  char *oldarray;
  char *newarray;
  int newelemsize;
  int oldelemsize;
  t_template *scalartemplate;
  int j;
  int i;
  _array *a_local;
  int *conformaction_local;
  t_template *tto_local;
  t_template *tfrom_local;
  
  if (a->a_templatesym == tfrom->t_sym) {
    iVar2 = tfrom->t_n * 8;
    iVar3 = tto->t_n * 8;
    pcVar4 = (char *)getbytes((long)(iVar3 * a->a_n));
    pcVar1 = a->a_vec;
    if (a->a_elemsize != iVar2) {
      bug("template_conformarray");
    }
    for (scalartemplate._4_4_ = 0; scalartemplate._4_4_ < a->a_n;
        scalartemplate._4_4_ = scalartemplate._4_4_ + 1) {
      word_init((t_word *)(pcVar4 + iVar3 * scalartemplate._4_4_),tto,&a->a_gp);
      template_conformwords
                (tfrom,tto,conformaction,(t_word *)(pcVar1 + iVar2 * scalartemplate._4_4_),
                 (t_word *)(pcVar4 + iVar3 * scalartemplate._4_4_));
      word_free((t_word *)(pcVar1 + iVar2 * scalartemplate._4_4_),tfrom);
    }
    a->a_vec = pcVar4;
    freebytes(pcVar1,(long)(iVar2 * a->a_n));
    _newelemsize = tto;
  }
  else {
    _newelemsize = template_findbyname(a->a_templatesym);
  }
  for (scalartemplate._4_4_ = 0; scalartemplate._4_4_ < a->a_n;
      scalartemplate._4_4_ = scalartemplate._4_4_ + 1) {
    pcVar1 = a->a_vec;
    iVar2 = a->a_n;
    for (scalartemplate._0_4_ = 0; (int)scalartemplate < _newelemsize->t_n;
        scalartemplate._0_4_ = (int)scalartemplate + 1) {
      if (_newelemsize->t_vec[(int)scalartemplate].ds_type == 3) {
        template_conformarray
                  (tfrom,tto,conformaction,
                   *(_array **)
                    (pcVar1 + (long)(int)scalartemplate * 8 +
                              (long)iVar2 * 8 * (long)scalartemplate._4_4_));
      }
    }
  }
  return;
}

Assistant:

static void template_conformarray(t_template *tfrom, t_template *tto,
    int *conformaction, t_array *a)
{
    int i, j;
    t_template *scalartemplate = 0;
    if (a->a_templatesym == tfrom->t_sym)
    {
        /* the array elements must all be conformed */
        int oldelemsize = sizeof(t_word) * tfrom->t_n,
            newelemsize = sizeof(t_word) * tto->t_n;
        char *newarray = getbytes(newelemsize * a->a_n);
        char *oldarray = a->a_vec;
        if (a->a_elemsize != oldelemsize)
            bug("template_conformarray");
        for (i = 0; i < a->a_n; i++)
        {
            t_word *wp = (t_word *)(newarray + newelemsize * i);
            word_init(wp, tto, &a->a_gp);
            template_conformwords(tfrom, tto, conformaction,
                (t_word *)(oldarray + oldelemsize * i), wp);
            word_free((t_word *)(oldarray + oldelemsize * i), tfrom);
        }
        scalartemplate = tto;
        a->a_vec = newarray;
        freebytes(oldarray, oldelemsize * a->a_n);
    }
    else scalartemplate = template_findbyname(a->a_templatesym);
        /* convert all arrays and sublist fields in each element of the array */
    for (i = 0; i < a->a_n; i++)
    {
        t_word *wp = (t_word *)(a->a_vec + sizeof(t_word) * a->a_n * i);
        for (j = 0; j < scalartemplate->t_n; j++)
        {
            t_dataslot *ds = scalartemplate->t_vec + j;
            if (ds->ds_type == DT_ARRAY)
            {
                template_conformarray(tfrom, tto, conformaction,
                    wp[j].w_array);
            }
        }
    }
}